

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void EthBasePort::PrintFirewirePacket(ostream *out,quadlet_t *packet,uint max_quads)

{
  byte bVar1;
  _Setfill<char> _Var2;
  uint uVar3;
  _Setw _Var4;
  ostream *poVar5;
  void *pvVar6;
  undefined8 uVar7;
  uint local_64;
  uint local_44;
  uint j;
  uint local_34;
  uint i;
  uint lim;
  uint local_24;
  uint data_length;
  uchar tcode;
  uint max_quads_local;
  quadlet_t *packet_local;
  ostream *out_local;
  
  uVar3 = (*packet & 0xf0) >> 4;
  bVar1 = (byte)uVar3;
  local_24 = 0;
  if (max_quads < 4) {
    poVar5 = std::operator<<(out,"PrintPacket: should print more than 4 quadlets (max_quads = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,max_quads);
    poVar5 = std::operator<<(poVar5,")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<(out,"Firewire Packet:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(out,"  dest: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,(*packet & 0xffc00000) >> 0x14);
    poVar5 = std::operator<<(poVar5,", node: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::dec);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,(*packet & 0x3f0000) >> 0x10);
    poVar5 = std::operator<<(poVar5,", tl: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
    _Var4 = std::setw(2);
    poVar5 = std::operator<<(poVar5,_Var4);
    _Var2 = std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,_Var2._M_c);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*packet & 0xfc00) >> 10);
    poVar5 = std::operator<<(poVar5,", rt: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*packet & 0x300) >> 8);
    poVar5 = std::operator<<(poVar5,", tcode: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," (");
    poVar5 = std::operator<<(poVar5,PrintFirewirePacket::tcode_name[bVar1]);
    poVar5 = std::operator<<(poVar5,")");
    poVar5 = std::operator<<(poVar5,", pri: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,*packet & 0xf);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(out,"  src: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,(packet[1] & 0xffc00000) >> 0x14);
    poVar5 = std::operator<<(poVar5,", node: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::dec);
    std::ostream::operator<<(pvVar6,(packet[1] & 0x3f0000) >> 0x10);
    if ((bVar1 == 6) || (bVar1 == 7)) {
      poVar5 = std::operator<<(out,", rcode: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::dec);
      std::ostream::operator<<(pvVar6,(packet[1] & 0xf0000) >> 0xc);
    }
    else if ((((bVar1 == 0) || (bVar1 == 4)) || (bVar1 == 1)) || (bVar1 == 5)) {
      poVar5 = std::operator<<(out,", dest_off: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,packet[1] & 0xffff);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(out,"  dest_off: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,packet[2]);
      std::ostream::operator<<(pvVar6,std::dec);
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    if (((bVar1 == 1) || (bVar1 == 7)) || (bVar1 == 5)) {
      local_24 = packet[3] >> 0x10;
      poVar5 = std::operator<<(out,"  data_length: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::dec);
      poVar5 = (ostream *)std::ostream::operator<<(pvVar6,local_24);
      poVar5 = std::operator<<(poVar5,", ext_tcode: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,packet[3] & 0xffff);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::dec);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      if ((local_24 & 3) != 0) {
        poVar5 = std::operator<<(out,"WARNING: data_length is not a multiple of 4");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    else if ((bVar1 == 0) || (bVar1 == 6)) {
      poVar5 = std::operator<<(out,"  data: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,packet[3]);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::dec);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    if (bVar1 == 4) {
      poVar5 = std::operator<<(out,"  header_crc: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,packet[3]);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::dec);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      if (max_quads < 5) {
        return;
      }
      poVar5 = std::operator<<(out,"  header_crc: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,packet[4]);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::dec);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    if ((bVar1 == 1) || (bVar1 == 7)) {
      local_24 = local_24 >> 2;
      local_64 = local_24;
      if (max_quads - 5 < local_24) {
        local_64 = max_quads - 5;
      }
      for (local_34 = 0; local_34 < local_64; local_34 = local_34 + 4) {
        poVar5 = std::operator<<(out,"  data[");
        uVar7 = std::ostream::operator<<(poVar5,std::dec);
        _Var2 = std::setfill<char>(' ');
        poVar5 = std::operator<<(uVar7,_Var2._M_c);
        _Var4 = std::setw(3);
        poVar5 = std::operator<<(poVar5,_Var4);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_34);
        poVar5 = std::operator<<(poVar5,":");
        _Var4 = std::setw(3);
        poVar5 = std::operator<<(poVar5,_Var4);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_34 + 3);
        std::operator<<(poVar5,"]:  ");
        for (local_44 = 0; local_44 < 4 && local_34 + local_44 < local_64; local_44 = local_44 + 1)
        {
          poVar5 = (ostream *)std::ostream::operator<<(out,std::hex);
          _Var4 = std::setw(8);
          poVar5 = std::operator<<(poVar5,_Var4);
          _Var2 = std::setfill<char>('0');
          poVar5 = std::operator<<(poVar5,_Var2._M_c);
          pvVar6 = (void *)std::ostream::operator<<(poVar5,packet[local_34 + 5 + local_44]);
          poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
          std::operator<<(poVar5,"  ");
        }
        std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
      }
      if ((local_24 != 0) && (local_24 < max_quads - 5)) {
        poVar5 = std::operator<<(out,"  data_crc: ");
        pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
        pvVar6 = (void *)std::ostream::operator<<(pvVar6,packet[local_24 + 5]);
        pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::dec);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void EthBasePort::PrintFirewirePacket(std::ostream &out, const quadlet_t *packet, unsigned int max_quads)
{
    static const char *tcode_name[16] = { "qwrite", "bwrite", "wresponse", "", "qread", "bread",
                                          "qresponse", "bresponse", "cycstart", "lockreq",
                                          "stream", "lockresp", "", "", "", "" };
    unsigned char tcode = (packet[0]&0x000000F0)>>4;
    unsigned int data_length = 0;
    // No point in printing anything if less than 4
    if (max_quads < 4) {
        out << "PrintPacket: should print more than 4 quadlets (max_quads = "
            << max_quads << ")" << std::endl;
        return;
    }
    out << "Firewire Packet:" << std::endl;
    out << "  dest: " << std::hex << ((packet[0]&0xffc00000)>>20)
        << ", node: " << std::dec << ((packet[0]&0x003f0000)>>16)
        << ", tl: " << std::hex << std::setw(2) << std::setfill('0') << ((packet[0]&0x0000fc00)>>10)
        << ", rt: " << ((packet[0]&0x00000300)>>8)
        << ", tcode: " << static_cast<unsigned int>(tcode) << " (" << tcode_name[tcode] << ")"
        << ", pri: " << (packet[0]&0x0000000F) << std::endl;
    out << "  src: " << std::hex << ((packet[1]&0xffc00000)>>20)
        << ", node: " << std::dec << ((packet[1]&0x003f0000)>>16);

    if ((tcode == QRESPONSE) || (tcode == BRESPONSE)) {
        out << ", rcode: " << std::dec << ((packet[1]&0x0000f0000)>>12);
    }
    else if ((tcode == QWRITE) || (tcode == QREAD) || (tcode == BWRITE) || (tcode == BREAD)) {
        out << ", dest_off: " << std::hex << (packet[1]&0x0000ffff) << std::endl;
        out << "  dest_off: " << packet[2] << std::dec;
    }
    out << std::endl;

    if ((tcode == BWRITE) || (tcode == BRESPONSE) || (tcode == BREAD)) {
        data_length = (packet[3]&0xffff0000) >> 16;
        out << "  data_length: " << std::dec << data_length
            << ", ext_tcode: " << std::hex << (packet[3]&0x0000ffff) << std::dec << std::endl;
        if (data_length%4 != 0)
            out << "WARNING: data_length is not a multiple of 4" << std::endl;
    }
    else if ((tcode == QWRITE) || (tcode == QRESPONSE)) {
        out << "  data: " << std::hex << packet[3] << std::dec << std::endl;
    }

    if (tcode == QREAD)
        out << "  header_crc: " << std::hex << packet[3] << std::dec << std::endl;
    else if (max_quads < 5)  // Nothing else to do for short packets
        return;
    else
        out << "  header_crc: " << std::hex << packet[4] << std::dec << std::endl;

    if ((tcode == BWRITE) || (tcode == BRESPONSE)) {
        data_length /= sizeof(quadlet_t);   // data_length in quadlets
        unsigned int lim = (data_length <= max_quads-5) ? data_length : max_quads-5;
        for (unsigned int i = 0; i < lim; i += 4) {
            out << "  data[" << std::dec << std::setfill(' ') << std::setw(3) << i << ":"
                << std::setw(3) << (i+3) << "]:  ";
            for (unsigned int j = 0; (j < 4) && ((i+j) < lim); j++)
                out << std::hex << std::setw(8) << std::setfill('0') << packet[5+i+j] << std::dec << "  ";
            out << std::endl;
        }
        if ((data_length > 0) && (data_length < max_quads-5))
            out << "  data_crc: " << std::hex << packet[5+data_length] << std::dec << std::endl;
    }
}